

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O1

void SRCTools::SincResampler::Utils::computeResampleFactors
               (uint *upsampleFactor,double *downsampleFactor,double inputFrequency,
               double outputFrequency,uint maxUpsampleFactor)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  uVar3 = (ulong)outputFrequency;
  uVar6 = (uint)uVar3;
  *upsampleFactor = uVar6;
  if (((double)(uVar3 & 0xffffffff) == outputFrequency) &&
     (!NAN((double)(uVar3 & 0xffffffff)) && !NAN(outputFrequency))) {
    uVar5 = (ulong)inputFrequency;
    dVar8 = (double)(uVar5 & 0xffffffff);
    if ((dVar8 == inputFrequency) && (!NAN(dVar8) && !NAN(inputFrequency))) {
      if ((int)uVar5 != 0) {
        uVar2 = uVar3 & 0xffffffff;
        uVar4 = uVar5 & 0xffffffff;
        do {
          uVar6 = (uint)uVar4;
          uVar1 = uVar2 % uVar4;
          uVar2 = uVar4;
          uVar4 = uVar1;
        } while ((int)uVar1 != 0);
      }
      if (1 < uVar6) {
        *upsampleFactor = (uint)((uVar3 & 0xffffffff) / (ulong)uVar6);
        dVar8 = (double)(int)((uVar5 & 0xffffffff) / (ulong)uVar6);
      }
      *downsampleFactor = dVar8;
      if (*upsampleFactor <= maxUpsampleFactor) {
        return;
      }
      goto LAB_0011eb07;
    }
  }
  if (maxUpsampleFactor != 0) {
    uVar6 = 1;
    do {
      dVar8 = (double)uVar6 * (inputFrequency / outputFrequency);
      dVar7 = floor(dVar8 * 1e+15 + 0.5);
      dVar8 = floor(dVar8 + 0.5);
      if ((dVar7 == dVar8 * 1e+15) && (!NAN(dVar7) && !NAN(dVar8 * 1e+15))) {
        *upsampleFactor = uVar6;
        goto LAB_0011eb24;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 <= maxUpsampleFactor);
  }
LAB_0011eb07:
  *upsampleFactor = maxUpsampleFactor;
  dVar8 = ((double)maxUpsampleFactor * inputFrequency) / outputFrequency;
LAB_0011eb24:
  *downsampleFactor = dVar8;
  return;
}

Assistant:

void Utils::computeResampleFactors(unsigned int &upsampleFactor, double &downsampleFactor, const double inputFrequency, const double outputFrequency, const unsigned int maxUpsampleFactor) {
	static const double RATIONAL_RATIO_ACCURACY_FACTOR = 1E15;

	upsampleFactor = static_cast<unsigned int>(outputFrequency);
	unsigned int downsampleFactorInt = static_cast<unsigned int>(inputFrequency);
	if ((upsampleFactor == outputFrequency) && (downsampleFactorInt == inputFrequency)) {
		// Input and output frequencies are integers, try to reduce them
		const unsigned int gcd = greatestCommonDivisor(upsampleFactor, downsampleFactorInt);
		if (gcd > 1) {
			upsampleFactor /= gcd;
			downsampleFactor = downsampleFactorInt / gcd;
		} else {
			downsampleFactor = downsampleFactorInt;
		}
		if (upsampleFactor <= maxUpsampleFactor) return;
	} else {
		// Try to recover rational resample ratio by brute force
		double inputToOutputRatio = inputFrequency / outputFrequency;
		for (unsigned int i = 1; i <= maxUpsampleFactor; ++i) {
			double testFactor = inputToOutputRatio * i;
			if (floor(RATIONAL_RATIO_ACCURACY_FACTOR * testFactor + 0.5) == RATIONAL_RATIO_ACCURACY_FACTOR * floor(testFactor + 0.5)) {
				// inputToOutputRatio found to be rational within the accuracy
				upsampleFactor = i;
				downsampleFactor = floor(testFactor + 0.5);
				return;
			}
		}
	}
	// Use interpolation of FIR taps as the last resort
	upsampleFactor = maxUpsampleFactor;
	downsampleFactor = maxUpsampleFactor * inputFrequency / outputFrequency;
}